

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString * __thiscall SimpleString::operator+=(SimpleString *this,char *rhs)

{
  size_t sVar1;
  size_t sVar2;
  SimpleString *this_00;
  char *bufferSize;
  char *in_RSI;
  SimpleString *in_RDI;
  char *tbuffer;
  size_t sizeOfNewString;
  size_t additionalStringSize;
  size_t originalSize;
  char *in_stack_ffffffffffffffd0;
  char *buffer;
  
  sVar1 = size((SimpleString *)0x176efc);
  sVar2 = StrLen(in_RSI);
  this_00 = (SimpleString *)(sVar2 + 1);
  buffer = (char *)((long)&this_00->buffer_ + sVar1);
  getBuffer(in_RDI);
  bufferSize = copyToNewBuffer(in_stack_ffffffffffffffd0,(size_t)in_RDI);
  StrNCpy(bufferSize + sVar1,in_RSI,(size_t)this_00);
  setInternalBufferTo(this_00,buffer,(size_t)bufferSize);
  return in_RDI;
}

Assistant:

SimpleString& SimpleString::operator+=(const char* rhs)
{
    size_t originalSize = this->size();
    size_t additionalStringSize = StrLen(rhs) + 1;
    size_t sizeOfNewString = originalSize + additionalStringSize;
    char* tbuffer = copyToNewBuffer(this->getBuffer(), sizeOfNewString);
    StrNCpy(tbuffer + originalSize, rhs, additionalStringSize);

    setInternalBufferTo(tbuffer, sizeOfNewString);
    return *this;
}